

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

QVariant * __thiscall
QFileSystemModel::headerData
          (QVariant *__return_storage_ptr__,QFileSystemModel *this,int section,
          Orientation orientation,int role)

{
  QArrayData *pQVar1;
  QImageData *pQVar2;
  undefined1 auVar3 [8];
  char16_t *pcVar4;
  int iVar5;
  long in_FS_OFFSET;
  QArrayData *local_58;
  char16_t *pcStack_50;
  QImageData *local_48;
  undefined1 local_38 [8];
  char16_t *pcStack_30;
  QImageData *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (role == 7) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      ::QVariant::QVariant(__return_storage_ptr__,1);
      return __return_storage_ptr__;
    }
    goto LAB_00621926;
  }
  if ((role == 1) && (section == 0)) {
    local_28 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pcStack_30 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)local_38,0x10,1,Format_ARGB32_Premultiplied);
    QImage::fill((QImage *)local_38,transparent);
    QImage::operator_cast_to_QVariant(__return_storage_ptr__,(QImage *)local_38);
    QImage::~QImage((QImage *)local_38);
  }
  else {
    if (orientation != Horizontal || role != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QAbstractItemModel::headerData((int)__return_storage_ptr__,(Orientation)this,section);
        return __return_storage_ptr__;
      }
      goto LAB_00621926;
    }
    local_38 = (undefined1  [8])0x0;
    pcStack_30 = (char16_t *)0x0;
    local_28 = (QImageData *)0x0;
    switch(section) {
    case 0:
      iVar5 = 0x6b49b0;
      break;
    case 1:
      iVar5 = 0x685a6c;
      break;
    case 2:
      iVar5 = 0x685a72;
      break;
    case 3:
      iVar5 = 0x6d75b6;
      break;
    default:
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      goto LAB_006218d3;
    }
    QMetaObject::tr((char *)&local_58,(char *)&staticMetaObject,iVar5);
    pcVar4 = pcStack_30;
    auVar3 = local_38;
    pQVar2 = local_48;
    pQVar1 = local_58;
    local_58 = (QArrayData *)local_38;
    local_38 = (undefined1  [8])pQVar1;
    pcStack_30 = pcStack_50;
    pcStack_50 = pcVar4;
    local_48 = local_28;
    local_28 = pQVar2;
    if (auVar3 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)auVar3)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)auVar3)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)auVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)auVar3,2,0x10);
      }
    }
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_38);
LAB_006218d3:
    if (local_38 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_38)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_38)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_38)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_38,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_00621926:
  __stack_chk_fail();
}

Assistant:

QVariant QFileSystemModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    switch (role) {
    case Qt::DecorationRole:
        if (section == 0) {
            // ### TODO oh man this is ugly and doesn't even work all the way!
            // it is still 2 pixels off
            QImage pixmap(16, 1, QImage::Format_ARGB32_Premultiplied);
            pixmap.fill(Qt::transparent);
            return pixmap;
        }
        break;
    case Qt::TextAlignmentRole:
        return Qt::AlignLeft;
    }

    if (orientation != Qt::Horizontal || role != Qt::DisplayRole)
        return QAbstractItemModel::headerData(section, orientation, role);

    QString returnValue;
    switch (section) {
    case QFileSystemModelPrivate::NameColumn:
        returnValue = tr("Name");
        break;
    case QFileSystemModelPrivate::SizeColumn:
        returnValue = tr("Size");
        break;
    case QFileSystemModelPrivate::TypeColumn:
        returnValue =
#ifdef Q_OS_MAC
                    tr("Kind", "Match OS X Finder");
#else
                    tr("Type", "All other platforms");
#endif
        break;
    // Windows   - Type
    // OS X      - Kind
    // Konqueror - File Type
    // Nautilus  - Type
    case QFileSystemModelPrivate::TimeColumn:
        returnValue = tr("Date Modified");
        break;
    default: return QVariant();
    }
    return returnValue;
}